

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O2

CHog * __thiscall CHog::visualizationHalf(CHog *this,Mat *image)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  _OutputArray *in_RDX;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int cellX;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  int local_b8;
  Matx<double,_4,_1> local_a0;
  double local_80;
  Mat *local_78;
  histCell **local_70;
  CHog *local_68;
  int **local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"visualization");
  std::endl<char,std::char_traits<char>>(poVar4);
  cv::Mat::Mat((Mat *)this,*(int *)(image + 0x1c) * *(int *)(image + 0x20),
               *(int *)(image + 0x20) * *(int *)(image + 0x18),0x10);
  if ((in_RDX->super__InputArray).sz == (Size)0x0) {
    local_a0.val[1] = (double)&local_70;
    local_70 = (histCell **)0x0;
    local_a0.val[0] = (double)CONCAT44(local_a0.val[0]._4_4_,-0x3efdfffa);
    local_a0.val[2] = 2.12199579145934e-314;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)this,(_InputArray *)&local_a0);
  }
  else {
    local_a0.val[2] = 0.0;
    local_a0.val[0] = (double)CONCAT44(local_a0.val[0]._4_4_,0x2010000);
    local_a0.val[1] = (double)this;
    cv::Mat::copyTo(in_RDX);
  }
  iVar7 = *(int *)(image + 0x1c);
  iVar5 = *(int *)(image + 0x18);
  iVar8 = 0;
  if (0 < iVar5) {
    iVar8 = iVar5;
  }
  iVar6 = 0;
  if (0 < iVar7) {
    iVar6 = iVar7;
  }
  dVar14 = -3.4028234663852886e+38;
  for (uVar10 = 1; uVar11 = 1, uVar10 != iVar6 + 1; uVar10 = uVar10 + 1) {
    for (; uVar11 != iVar8 + 1; uVar11 = uVar11 + 1) {
      lVar2 = *(long *)(*(long *)image + uVar10 * 8);
      uVar1 = *(uint *)(lVar2 + 0x18 + uVar11 * 0x30);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar12 = 0; uVar1 != uVar12; uVar12 = uVar12 + 1) {
        dVar13 = *(double *)(*(long *)(lVar2 + uVar11 * 0x30) + uVar12 * 8);
        if (dVar13 <= dVar14) {
          dVar13 = dVar14;
        }
        dVar14 = dVar13;
      }
    }
  }
  local_80 = dVar14;
  local_78 = image;
  for (uVar10 = 1; (long)uVar10 <= (long)iVar7; uVar10 = uVar10 + 1) {
    iVar7 = ((uint)(uVar10 >> 1) & 0x7fffffff) + ((int)uVar10 + -1) * *(int *)(image + 0x20);
    for (local_38 = 1; (long)local_38 <= (long)iVar5; local_38 = local_38 + 1) {
      lVar2 = *(long *)(*(long *)image + uVar10 * 8);
      lVar9 = local_38 * 0x30;
      uVar1 = *(uint *)(lVar2 + 0x18 + lVar9);
      iVar8 = (int)((**(double **)(lVar2 + lVar9) / dVar14) * 255.0);
      iVar5 = ((uint)(local_38 >> 1) & 0x7fffffff) + ((int)local_38 + -1) * *(int *)(image + 0x20);
      uVar12 = 0;
      uVar11 = 0;
      if (0 < (int)uVar1) {
        uVar11 = (ulong)uVar1;
      }
      local_b8 = 0;
      for (; image = local_78, local_68 = this, uVar11 != uVar12; uVar12 = uVar12 + 1) {
        iVar6 = (int)((*(double *)
                        (*(long *)(*(long *)(*(long *)local_78 + uVar10 * 8) + lVar9) + uVar12 * 8)
                      / dVar14) * 255.0);
        iVar3 = (int)uVar12;
        if (iVar6 <= iVar8) {
          local_60 = (int **)0x0;
          local_70 = (histCell **)CONCAT44(local_70._4_4_,0x3010000);
          local_44 = *(int *)(local_78 + 0x20) / 2;
          local_48 = 0;
          local_40 = iVar5;
          local_3c = iVar7;
          cv::Matx<double,_4,_1>::Matx(&local_a0);
          local_a0.val[0] = 0.0;
          local_a0.val[3] = 0.0;
          local_a0.val[1] = (double)iVar6;
          local_a0.val[2] = (double)iVar6;
          cv::ellipse((double)((int)uVar12 * (int)(0xb4 / (long)(int)uVar1)),0,0x4076800000000000,
                      &local_70,&local_40,&local_48,&local_a0,0xffffffffffffffff,8,0,iVar7);
          dVar14 = local_80;
          iVar6 = iVar8;
          iVar3 = local_b8;
        }
        local_b8 = iVar3;
        iVar8 = iVar6;
      }
      local_60 = (int **)0x0;
      local_70 = (histCell **)CONCAT44(local_70._4_4_,0x3010000);
      local_54 = *(int *)(local_78 + 0x20) / 2;
      local_58 = 0;
      local_50 = iVar5;
      local_4c = iVar7;
      cv::Matx<double,_4,_1>::Matx(&local_a0);
      local_a0.val[0] = 0.0;
      local_a0.val[3] = 0.0;
      local_a0.val[1] = (double)iVar8;
      local_a0.val[2] = (double)iVar8;
      cv::ellipse((double)((int)(0xb4 / (long)(int)uVar1) * local_b8),0,0x4076800000000000,&local_70
                  ,&local_50,&local_58,&local_a0,0xffffffffffffffff,8,0,iVar7);
      iVar5 = *(int *)(image + 0x18);
      dVar14 = local_80;
    }
    iVar7 = *(int *)(image + 0x1c);
  }
  return this;
}

Assistant:

cv::Mat CHog::visualizationHalf(cv::Mat image)
{
    cout<<"visualization"<<endl;
    cv::Mat visual(cellSize*numCellY, cellSize*numCellX, CV_8UC3);
    if(image.data!=NULL)
        image.copyTo(visual);
    else
        visual.setTo(0);
    double maxBinValue = -FLT_MAX;
    int pixValue;
    cv::Point start, end, center;
    int numOri, maxIdx, maxValue;
    for(int cellY = 1; cellY<numCellY+1; cellY++)
    {
        for(int cellX = 1; cellX<numCellX+1; cellX++)
        {
            numOri = hist[cellY][cellX].numOriHalf;
            for(int b = 0; b<numOri; b++)
                maxBinValue = hist[cellY][cellX].cellBinsHalf[b]>maxBinValue ? hist[cellY][cellX].cellBinsHalf[b] : maxBinValue;
        }
    }
    for(int cellY = 1; cellY<numCellY+1; cellY++)
    {
        center.y = (cellY-1) * cellSize + cellY/2;
        for(int cellX = 1; cellX<numCellX+1; cellX++)
        {
            numOri = hist[cellY][cellX].numOriHalf;
            maxIdx = 0;
            maxValue = hist[cellY][cellX].cellBinsHalf[0]/maxBinValue*255;
            center.x = (cellX-1) * cellSize + cellX/2;

            for(int b = 0; b<numOri; b++)
            {
                pixValue = hist[cellY][cellX].cellBinsHalf[b]/maxBinValue*255;
                if(pixValue>maxValue)
                {
                    maxValue = pixValue;
                    maxIdx = b;
                }
                else
                    cv::ellipse(visual, center, cv::Size(0, cellSize/2), b*(180/numOri), 0, 360, cv::Scalar(0, pixValue, pixValue), -1);
            }
            cv::ellipse(visual, center, cv::Size(0, cellSize/2), maxIdx*(180/numOri), 0, 360, cv::Scalar(0, maxValue, maxValue), -1);
            //cv::line(visual, cv::Point((cellX-1) * cellSize, 0), cv::Point((cellX-1) * cellSize, imgHeight), cv::Scalar(255,0,0));
        }
        //cv::line(visual, cv::Point(0, (cellY-1) * cellSize), cv::Point(imgWidth, (cellY-1) * cellSize), cv::Scalar(255,0,0));
    }
    return visual;
}